

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_SetElementIStrict<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  ImplicitCallFlags flags;
  ScriptContext *this_00;
  ThreadContext *this_01;
  ImplicitCallFlags savedImplicitCallFlags;
  ThreadContext *threadContext;
  OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  this_00 = GetScriptContext(this);
  this_01 = ScriptContext::GetThreadContext(this_00);
  flags = ThreadContext::GetImplicitCallFlags(this_01);
  ThreadContext::ClearImplicitCallFlags(this_01);
  OP_SetElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
            (this,playout,PropertyOperation_StrictMode);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_01);
  ThreadContext::AddImplicitCallFlags(this_01,flags);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SetElementIStrict(const unaligned T* playout)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        OP_SetElementI(playout, PropertyOperation_StrictMode);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }